

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeIO.cpp
# Opt level: O0

bool BytecodeIO::readBytecode
               (string *filepath,vector<unsigned_int,_std::allocator<unsigned_int>_> *bytecode)

{
  byte bVar1;
  _Ios_Openmode __a;
  ulong uVar2;
  reference pvVar3;
  bool bVar4;
  undefined8 local_248;
  streampos fileSize;
  string local_228 [8];
  ifstream file;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *bytecode_local;
  string *filepath_local;
  
  std::ifstream::ifstream(local_228);
  __a = std::operator|(_S_in,_S_bin);
  std::operator|(__a,_S_ate);
  std::ifstream::open(local_228,(_Ios_Openmode)filepath);
  bVar1 = std::ifstream::is_open();
  bVar4 = (bVar1 & 1) != 0;
  if (bVar4) {
    _local_248 = std::istream::tellg();
    std::istream::seekg((long)local_228,_S_beg);
    uVar2 = std::fpos::operator_cast_to_long((fpos *)&stack0xfffffffffffffdb8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(bytecode,uVar2 >> 2);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](bytecode,0);
    std::fpos::operator_cast_to_long((fpos *)&stack0xfffffffffffffdb8);
    std::istream::read((char *)local_228,(long)pvVar3);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_228);
  return bVar4;
}

Assistant:

bool BytecodeIO::readBytecode(const std::string& filepath, std::vector<unsigned int>& bytecode)
{
    //Open the file
    std::ifstream file;
    file.open(filepath, std::ios::in | std::ios::binary | std::ios::ate);
    if(!file.is_open())
        return false;

    //Get file size
    std::streampos fileSize = file.tellg();
    file.seekg(0, std::ios::beg);

    //Reserve space in the vector and read the data
    bytecode.resize(fileSize / sizeof(decltype(bytecode.begin())::value_type));
    file.read((char*)&bytecode[0], fileSize);

    file.close();
    return true;
}